

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O2

bool __thiscall
SocketInternals::Open(SocketInternals *this,string *host,string *multicast,unsigned_short port)

{
  uint32_t uVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  uint uVar5;
  uint32_t IPaddr;
  uint32_t IPaddr_00;
  ushort uVar6;
  bool bVar7;
  int packetInfo;
  int broadcastEnable;
  string local_50;
  
  (this->ServerAddr).sin_family = 2;
  uVar6 = port << 8 | port >> 8;
  (this->ServerAddr).sin_port = uVar6;
  uVar1 = EthUdpPort::IP_ULong(host);
  (this->ServerAddr).sin_addr.s_addr = uVar1;
  iVar2 = socket(2,2,0);
  this->SocketFD = iVar2;
  if (iVar2 == -1) {
    poVar4 = std::operator<<(this->outStr,"Failed to open UDP socket");
    std::endl<char,std::char_traits<char>>(poVar4);
    bVar7 = false;
  }
  else {
    packetInfo = 1;
    broadcastEnable = packetInfo;
    iVar2 = setsockopt(iVar2,1,6,&broadcastEnable,4);
    bVar7 = iVar2 == 0;
    if (bVar7) {
      iVar2 = setsockopt(this->SocketFD,0,8,&packetInfo,4);
      if (iVar2 != 0) {
        poVar4 = std::operator<<(this->outStr,"Open: Failed to set SOCKET packet info option");
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      (this->ServerAddrBroadcast).sin_family = 2;
      (this->ServerAddrBroadcast).sin_port = uVar6;
      uVar3 = (this->ServerAddr).sin_addr.s_addr;
      uVar5 = uVar3 & 0xff;
      if (uVar5 < 0x80) {
        uVar3 = uVar3 | 0xffffff00;
      }
      else if (uVar5 < 0xc0) {
        uVar3 = uVar3 | 0xffff0000;
      }
      else {
        uVar3 = uVar3 | 0xff000000;
        if (0xdf < uVar5) {
          uVar3 = 0xffffffff;
        }
      }
      (this->ServerAddrBroadcast).sin_addr.s_addr = uVar3;
      (this->ServerAddrMulticast).sin_family = 2;
      (this->ServerAddrMulticast).sin_port = uVar6;
      uVar1 = EthUdpPort::IP_ULong(multicast);
      (this->ServerAddrMulticast).sin_addr.s_addr = uVar1;
      poVar4 = std::operator<<(this->outStr,"Server IP: ");
      poVar4 = std::operator<<(poVar4,(string *)host);
      poVar4 = std::operator<<(poVar4,", Port: ");
      *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
           *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,port);
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<(this->outStr,"Broadcast IP: ");
      EthUdpPort::IP_String_abi_cxx11_
                (&local_50,(EthUdpPort *)(ulong)(this->ServerAddrBroadcast).sin_addr.s_addr,IPaddr);
      poVar4 = std::operator<<(poVar4,(string *)&local_50);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)&local_50);
      poVar4 = std::operator<<(this->outStr,"Multicast IP: ");
      EthUdpPort::IP_String_abi_cxx11_
                (&local_50,(EthUdpPort *)(ulong)(this->ServerAddrMulticast).sin_addr.s_addr,
                 IPaddr_00);
      poVar4 = std::operator<<(poVar4,(string *)&local_50);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      poVar4 = std::operator<<(this->outStr,"Open: Failed to set SOCKET broadcast option");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
  return bVar7;
}

Assistant:

bool SocketInternals::Open(const std::string &host, const std::string &multicast, unsigned short port)
{
#ifdef _MSC_VER
    WSADATA wsaData;
    int retval = WSAStartup(WINSOCKVERSION, &wsaData);
    if (retval != 0) {
        outStr << "WSAStartup failed with error code " << retval << std::endl;
        return false;
    }
#endif
    ServerAddr.sin_family = AF_INET;
    ServerAddr.sin_port = htons(port);
    ServerAddr.sin_addr.s_addr = EthUdpPort::IP_ULong(host);

    // Open UDP socket
    SocketFD = socket(PF_INET, SOCK_DGRAM, 0);
    if (SocketFD == INVALID_SOCKET) {
        outStr << "Failed to open UDP socket" << std::endl;
        return false;
    }

    // Enable broadcasts
#ifdef _MSC_VER
    BOOL broadcastEnable = TRUE;
    DWORD packetInfo = 1;
    if (setsockopt(SocketFD, SOL_SOCKET, SO_BROADCAST, reinterpret_cast<const char *>(&broadcastEnable),
                   sizeof(broadcastEnable)) != 0) {
        outStr << "Open: Failed to set SOCKET broadcast option" << std::endl;
        return false;
    }

    if (setsockopt(SocketFD, IPPROTO_IP, IP_PKTINFO, reinterpret_cast<const char *>(&packetInfo),
                   sizeof(packetInfo)) != 0) {
        outStr << "Open: Failed to set SOCKET packet info option" << std::endl;
    }
#else
    int broadcastEnable = 1;
    int packetInfo = 1;
    if (setsockopt(SocketFD, SOL_SOCKET, SO_BROADCAST, &broadcastEnable, sizeof(broadcastEnable)) != 0) {
        outStr << "Open: Failed to set SOCKET broadcast option" << std::endl;
        return false;
    }

    if (setsockopt(SocketFD, IPPROTO_IP, IP_PKTINFO, &packetInfo, sizeof(packetInfo)) != 0) {
        outStr << "Open: Failed to set SOCKET packet info option" << std::endl;
    }
#endif

    // Determine the broadcast address. For simplicity, we assume that this is a Class A, B, or C network,
    // as defined by the InterNIC:
    //    Class A: first byte is 0-127, default subnet mask is 255.0.0.0
    //    Class B: first byte is 128-191, default subnet mask is 255.255.0.0
    //    Class C: first byte is 192-223, default subnet mask is 255.255.255.0
    // If the first byte is greater than 223, we use the global broadcast address, 255.255.255.255

    ServerAddrBroadcast.sin_family = AF_INET;
    ServerAddrBroadcast.sin_port = htons(port);
    unsigned char firstByte = static_cast<unsigned char>(ServerAddr.sin_addr.s_addr&0x000000ff);
    if (firstByte < 128)
        ServerAddrBroadcast.sin_addr.s_addr = ServerAddr.sin_addr.s_addr|0xffffff00;
    else if (firstByte < 192)
        ServerAddrBroadcast.sin_addr.s_addr = ServerAddr.sin_addr.s_addr|0xffff0000;
    else if (firstByte < 224)
        ServerAddrBroadcast.sin_addr.s_addr = ServerAddr.sin_addr.s_addr|0xff000000;
    else
        ServerAddrBroadcast.sin_addr.s_addr = 0xffffffff;

    // UDP Multicast address
    ServerAddrMulticast.sin_family = AF_INET;
    ServerAddrMulticast.sin_port = htons(port);
    ServerAddrMulticast.sin_addr.s_addr = EthUdpPort::IP_ULong(multicast);

    outStr << "Server IP: " << host << ", Port: " << std::dec << port << std::endl;
    outStr << "Broadcast IP: " << EthUdpPort::IP_String(ServerAddrBroadcast.sin_addr.s_addr) << std::endl;
    outStr << "Multicast IP: " << EthUdpPort::IP_String(ServerAddrMulticast.sin_addr.s_addr) << std::endl;
    return true;
}